

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

uintptr_t ngx_escape_json(u_char *dst,u_char *src,size_t size)

{
  byte bVar1;
  size_t sVar2;
  byte bVar3;
  
  if (dst == (u_char *)0x0) {
    if (size == 0) {
      return 0;
    }
    sVar2 = 0;
    dst = (u_char *)0x0;
    do {
      bVar1 = src[sVar2];
      if ((bVar1 == 0x5c) || (bVar1 == 0x22)) {
        dst = dst + 1;
      }
      else if (bVar1 < 0x20) {
        dst = dst + 5;
      }
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
  }
  else if (size != 0) {
    sVar2 = 0;
    do {
      bVar1 = src[sVar2];
      if (bVar1 < 0x20) {
        dst[0] = 0x5c;
        dst[1] = 0x75;
        dst[2] = 0x30;
        dst[3] = 0x30;
        dst[4] = bVar1 >> 4 | 0x30;
        bVar3 = (bVar1 & 0xf) + 0x37;
        if ((bVar1 & 0xf) < 10) {
          bVar3 = bVar1 | 0x30;
        }
        dst[5] = bVar3;
        dst = dst + 6;
      }
      else {
        if ((bVar1 == 0x5c) || (bVar1 == 0x22)) {
          *dst = 0x5c;
          dst = dst + 1;
        }
        *dst = bVar1;
        dst = dst + 1;
      }
      sVar2 = sVar2 + 1;
    } while (size != sVar2);
    return (uintptr_t)dst;
  }
  return (uintptr_t)dst;
}

Assistant:

uintptr_t
ngx_escape_json(u_char *dst, u_char *src, size_t size)
{
    u_char      ch;
    ngx_uint_t  len;

    if (dst == NULL) {
        len = 0;

        while (size) {
            ch = *src++;

            if (ch == '\\' || ch == '"') {
                len++;

            } else if (ch <= 0x1f) {
                len += sizeof("\\u001F") - 2;
            }

            size--;
        }

        return (uintptr_t) len;
    }

    while (size) {
        ch = *src++;

        if (ch > 0x1f) {

            if (ch == '\\' || ch == '"') {
                *dst++ = '\\';
            }

            *dst++ = ch;

        } else {
            *dst++ = '\\'; *dst++ = 'u'; *dst++ = '0'; *dst++ = '0';
            *dst++ = '0' + (ch >> 4);

            ch &= 0xf;

            *dst++ = (ch < 10) ? ('0' + ch) : ('A' + ch - 10);
        }

        size--;
    }

    return (uintptr_t) dst;
}